

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall
cmDocumentation::SetSection(cmDocumentation *this,char *name,cmDocumentationSection *section)

{
  cmDocumentationSection *this_00;
  cmDocumentationSection *section_local;
  char *name_local;
  cmDocumentation *this_local;
  
  this_00 = SectionAtName(this,name);
  cmDocumentationSection::operator=(this_00,section);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name,
                                 cmDocumentationSection section)
{
  this->SectionAtName(name) = std::move(section);
}